

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.cc
# Opt level: O1

uint32_t __thiscall re2c::Enc::decodeUnsafe(Enc *this,uint32_t c)

{
  if (this->type_ == EBCDIC) {
    c = *(uint32_t *)(ebc2asc + (ulong)(c & 0xff) * 4);
  }
  return c;
}

Assistant:

uint32_t Enc::decodeUnsafe(uint32_t c) const
{
	switch (type_)
	{
		case EBCDIC:
			c = ebc2asc[c & 0xFF];
			break;
		case ASCII:
		case UCS2:
		case UTF16:
		case UTF32:
		case UTF8:
			break;
	}
	return c;
}